

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O0

int32_t llama_chat_apply_template
                  (char *tmpl,llama_chat_message *chat,size_t n_msg,bool add_ass,char *buf,
                  int32_t length)

{
  llm_chat_template lVar1;
  value_type plVar2;
  reference pplVar3;
  char *__src;
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  char *in_RDI;
  char *in_R8;
  int in_R9D;
  int32_t res;
  llm_chat_template detected_tmpl;
  string formatted_chat;
  size_t i;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> chat_vec;
  string curr_tmpl;
  undefined1 in_stack_000016cf;
  string *in_stack_000016d0;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> *in_stack_000016d8
  ;
  llm_chat_template in_stack_000016e0;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> *this;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> *this_00;
  string *tmpl_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  size_type local_90;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> local_88;
  undefined1 local_59 [37];
  int local_34;
  char *local_30;
  byte local_21;
  ulong local_20;
  long local_18;
  int32_t local_4;
  
  local_21 = in_CL & 1;
  if ((string *)in_RDI == (string *)0x0) {
    in_RDI = "chatml";
  }
  this_00 = (vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> *)
            local_59;
  tmpl_00 = (string *)in_RDI;
  local_34 = in_R9D;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  this = &local_88;
  std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::vector
            ((vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> *)
             0x3aa071);
  std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::resize
            (this_00,(size_type)in_RDI);
  for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
    plVar2 = (value_type)(local_18 + local_90 * 0x10);
    pplVar3 = std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::
              operator[](&local_88,local_90);
    *pplVar3 = plVar2;
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffff50);
  lVar1 = llm_chat_detect_template(tmpl_00);
  if (lVar1 == LLM_CHAT_TEMPLATE_UNKNOWN) {
    local_4 = -1;
  }
  else {
    local_4 = llm_chat_apply_template
                        (in_stack_000016e0,in_stack_000016d8,in_stack_000016d0,
                         (bool)in_stack_000016cf);
    if (((-1 < local_4) && (local_30 != (char *)0x0)) && (0 < local_34)) {
      __src = (char *)std::__cxx11::string::c_str();
      strncpy(local_30,__src,(long)local_34);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::~vector
            (this);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  return local_4;
}

Assistant:

int32_t llama_chat_apply_template(
                              const char * tmpl,
         const struct llama_chat_message * chat,
                                  size_t   n_msg,
                                    bool   add_ass,
                                    char * buf,
                                 int32_t   length) {
    const std::string curr_tmpl(tmpl == nullptr ? "chatml" : tmpl);

    // format the chat to string
    std::vector<const llama_chat_message *> chat_vec;
    chat_vec.resize(n_msg);
    for (size_t i = 0; i < n_msg; i++) {
        chat_vec[i] = &chat[i];
    }

    std::string formatted_chat;
    llm_chat_template detected_tmpl = llm_chat_detect_template(curr_tmpl);
    if (detected_tmpl == LLM_CHAT_TEMPLATE_UNKNOWN) {
        return -1;
    }
    int32_t res = llm_chat_apply_template(detected_tmpl, chat_vec, formatted_chat, add_ass);
    if (res < 0) {
        return res;
    }
    if (buf && length > 0) {
        strncpy(buf, formatted_chat.c_str(), length);
    }
    return res;
}